

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_32UL,_0UL,_3UL,_24UL,_10UL,_boost::random::detail::M1,_boost::random::detail::M3<8>,_boost::random::detail::M3<-19>,_boost::random::detail::M3<-14>,_boost::random::detail::M3<-11>,_boost::random::detail::M3<-7>,_boost::random::detail::M3<-13>,_boost::random::detail::M0,_boost::random::detail::no_tempering>,_3498005132U>
     ::run(void)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  basic_cstring<const_char> local_290;
  basic_cstring<const_char> local_280;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_270;
  assertion_result local_250;
  basic_cstring<const_char> local_238;
  basic_cstring<const_char> local_228;
  basic_cstring<const_char> local_218;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_208;
  basic_cstring<const_char> local_1e0;
  basic_cstring<const_char> local_1d0;
  undefined4 local_1c0;
  result_type local_1bc;
  basic_cstring<const_char> local_1b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1a8;
  basic_cstring<const_char> local_180;
  basic_cstring<const_char> local_170;
  undefined4 local_160;
  result_type local_15c;
  basic_cstring<const_char> local_158;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_148;
  basic_cstring<const_char> local_120;
  basic_cstring<const_char> local_110;
  undefined4 local_fc;
  result_type local_f8 [4];
  basic_cstring<const_char> local_e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_d8;
  basic_cstring<const_char> local_b0;
  basic_cstring<const_char> local_a0;
  undefined1 local_90 [8];
  WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_32UL,_0UL,_3UL,_24UL,_10UL,_boost::random::detail::M1,_boost::random::detail::M3<8>,_boost::random::detail::M3<_19>,_boost::random::detail::M3<_14>,_boost::random::detail::M3<_11>,_boost::random::detail::M3<_7>,_boost::random::detail::M3<_13>,_boost::random::detail::M0,_boost::random::detail::no_tempering>,_3498005132U>
  c;
  
  WellTestCase((WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_32UL,_0UL,_3UL,_24UL,_10UL,_boost::random::detail::M1,_boost::random::detail::M3<8>,_boost::random::detail::M3<_19>,_boost::random::detail::M3<_14>,_boost::random::detail::M3<_11>,_boost::random::detail::M3<_7>,_boost::random::detail::M3<_13>,_boost::random::detail::M0,_boost::random::detail::no_tempering>,_3498005132U>
                *)local_90);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_a0,0x43,&local_b0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_d8,plVar3,(char (*) [1])0x15b00a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    local_f8[0] = generate((WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_32UL,_0UL,_3UL,_24UL,_10UL,_boost::random::detail::M1,_boost::random::detail::M3<8>,_boost::random::detail::M3<_19>,_boost::random::detail::M3<_14>,_boost::random::detail::M3<_11>,_boost::random::detail::M3<_7>,_boost::random::detail::M3<_13>,_boost::random::detail::M0,_boost::random::detail::no_tempering>,_3498005132U>
                            *)local_90);
    local_fc = 0xd07f528c;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_d8,&local_e8,0x43,1,2,local_f8,"c.generate()",&local_fc,"Expected");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_d8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_110,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_120);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_110,0x44,&local_120);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_148,plVar3,(char (*) [1])0x15b00a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_158,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    local_15c = boost::random::
                well_engine<unsigned_int,_32UL,_32UL,_0UL,_3UL,_24UL,_10UL,_boost::random::detail::M1,_boost::random::detail::M3<8>,_boost::random::detail::M3<-19>,_boost::random::detail::M3<-14>,_boost::random::detail::M3<-11>,_boost::random::detail::M3<-7>,_boost::random::detail::M3<-13>,_boost::random::detail::M0,_boost::random::detail::no_tempering>
                ::min();
    local_160 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_148,&local_158,0x44,1,2,&local_15c,"c.rng.min()",&local_160,"0U");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_148);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_170,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_180);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_170,0x45,&local_180);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1a8,plVar3,(char (*) [1])0x15b00a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    local_1bc = boost::random::
                well_engine<unsigned_int,_32UL,_32UL,_0UL,_3UL,_24UL,_10UL,_boost::random::detail::M1,_boost::random::detail::M3<8>,_boost::random::detail::M3<-19>,_boost::random::detail::M3<-14>,_boost::random::detail::M3<-11>,_boost::random::detail::M3<-7>,_boost::random::detail::M3<-13>,_boost::random::detail::M0,_boost::random::detail::no_tempering>
                ::max();
    local_1c0 = 0xffffffff;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_1a8,&local_1b8,0x45,1,2,&local_1bc,"c.rng.max()",&local_1c0,"~0U");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1d0,0x46,&local_1e0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_208,plVar3,(char (*) [1])0x15b00a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_218,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::random::well_engine<unsigned_int,32ul,32ul,0ul,3ul,24ul,10ul,boost::random::detail::M1,boost::random::detail::M3<8>,boost::random::detail::M3<_19>,boost::random::detail::M3<_14>,boost::random::detail::M3<_11>,boost::random::detail::M3<_7>,boost::random::detail::M3<_13>,boost::random::detail::M0,boost::random::detail::no_tempering>,boost::random::well_engine<unsigned_int,32ul,32ul,0ul,3ul,24ul,10ul,boost::random::detail::M1,boost::random::detail::M3<8>,boost::random::detail::M3<_19>,boost::random::detail::M3<_14>,boost::random::detail::M3<_11>,boost::random::detail::M3<_7>,boost::random::detail::M3<_13>,boost::random::detail::M0,boost::random::detail::no_tempering>>
              (&local_208,&local_218,0x46,1,2,local_90,"c.rng",local_90,"c.rng");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_208);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_228,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_238);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_228,0x47,&local_238);
    bVar2 = boost::random::operator==
                      ((well_engine<unsigned_int,_32UL,_32UL,_0UL,_3UL,_24UL,_10UL,_boost::random::detail::M1,_boost::random::detail::M3<8>,_boost::random::detail::M3<_19>,_boost::random::detail::M3<_14>,_boost::random::detail::M3<_11>,_boost::random::detail::M3<_7>,_boost::random::detail::M3<_13>,_boost::random::detail::M0,_boost::random::detail::no_tempering>
                        *)local_90,
                       (well_engine<unsigned_int,_32UL,_32UL,_0UL,_3UL,_24UL,_10UL,_boost::random::detail::M1,_boost::random::detail::M3<8>,_boost::random::detail::M3<_19>,_boost::random::detail::M3<_14>,_boost::random::detail::M3<_11>,_boost::random::detail::M3<_7>,_boost::random::detail::M3<_13>,_boost::random::detail::M0,_boost::random::detail::no_tempering>
                        *)local_90);
    boost::test_tools::assertion_result::assertion_result(&local_250,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_280,"c.rng == c.rng",0xe);
    boost::unit_test::operator<<(&local_270,plVar3,&local_280);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_290,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::report_assertion(&local_250,&local_270,&local_290,0x47,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_270);
    boost::test_tools::assertion_result::~assertion_result(&local_250);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

static void run()
    {
        WellTestCase c;

        BOOST_CHECK_EQUAL(c.generate(), Expected);
        BOOST_CHECK_EQUAL(c.rng.min(), 0U);
        BOOST_CHECK_EQUAL(c.rng.max(), ~0U);
        BOOST_CHECK_EQUAL(c.rng, c.rng);
        BOOST_CHECK(c.rng == c.rng);
    }